

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_maps.hpp
# Opt level: O0

void PatchOptimizeMaps::remove_useless_entities(World *world)

{
  initializer_list<unsigned_short> __l;
  bool bVar1;
  reference puVar2;
  Map *pMVar3;
  const_iterator cStack_88;
  uint16_t map_id;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  allocator<unsigned_short> local_59;
  unsigned_short local_58 [16];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> MAPS_TO_CLEAR_ENTITIES_FROM;
  World *world_local;
  
  local_58[8] = 0x61;
  local_58[9] = 0x40;
  local_58[10] = 0x273;
  local_58[0xb] = 0xaa;
  local_58[0xc] = 0x5e;
  local_58[0] = 0x37;
  local_58[1] = 0x3b;
  local_58[2] = 0x1c6;
  local_58[3] = 0x259;
  local_58[4] = 0x55;
  local_58[5] = 0x23;
  local_58[6] = 0x60;
  local_58[7] = 0x67;
  local_38 = local_58;
  local_30 = 0xd;
  MAPS_TO_CLEAR_ENTITIES_FROM.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)world;
  std::allocator<unsigned_short>::allocator(&local_59);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_28,__l,&local_59);
  std::allocator<unsigned_short>::~allocator(&local_59);
  __end1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_28);
  cStack_88 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_28);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      (&__end1,&stack0xffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&__end1);
    pMVar3 = World::map((World *)MAPS_TO_CLEAR_ENTITIES_FROM.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,*puVar2);
    Map::clear_entities(pMVar3);
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&__end1);
  }
  pMVar3 = World::map((World *)MAPS_TO_CLEAR_ENTITIES_FROM.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  Map::remove_entity(pMVar3,'\a',true);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_28);
  return;
}

Assistant:

static void remove_useless_entities(World& world)
    {
        const std::vector<uint16_t> MAPS_TO_CLEAR_ENTITIES_FROM = {
                MAP_MERCATOR_CASTLE_ENTRANCE_HALLWAY,
                MAP_MERCATOR_CASTLE_MAIN_HALL,
                MAP_ROUTE_GUMI_RYUMA_MERCATOR_GATES,
                MAP_GUMI_EXTERIOR,
                MAP_MERCATOR_CASTLE_BANQUET_ROOM,
                MAP_MECATOR_CASTLE_TOWER_SUMMIT,
                MAP_MERCATOR_CASTLE_ZAK_ROOM,
                MAP_MERCATOR_CASTLE_DEXTER_ROOM,
                MAP_MERCATOR_CASTLE_NIGEL_ROOM,
                MAP_MERCATOR_CASTLE_ARMORY_BARRACKS,
                MAP_RYUMA_LIGHTHOUSE, // Base Ryuma lighthouse (before Duke breaks it) is not reachable
                MAP_KN_CAVE_TELEPORTER_TO_KAZALT,
                MAP_MERCATOR_CASTLE_2F_HALLWAY
        };

        for(uint16_t map_id : MAPS_TO_CLEAR_ENTITIES_FROM)
            world.map(map_id)->clear_entities();

        // Remove a useless Miro from a map in Swamp Shrine
        world.map(MAP_SWAMP_SHRINE_0)->remove_entity(7);
    }